

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityComponentStore.cpp
# Opt level: O1

void __thiscall EntityComponentStoreTests::Run(EntityComponentStoreTests *this)

{
  EntityComponentStoreTests *local_2d8;
  undefined8 uStack_2d0;
  code *local_2c8;
  code *pcStack_2c0;
  EntityComponentStoreTests *local_2b8;
  undefined8 uStack_2b0;
  code *local_2a8;
  code *pcStack_2a0;
  EntityComponentStoreTests *local_298;
  undefined8 uStack_290;
  code *local_288;
  code *pcStack_280;
  EntityComponentStoreTests *local_278;
  undefined8 uStack_270;
  code *local_268;
  code *pcStack_260;
  EntityComponentStoreTests *local_258;
  undefined8 uStack_250;
  code *local_248;
  code *pcStack_240;
  EntityComponentStoreTests *local_238;
  undefined8 uStack_230;
  code *local_228;
  code *pcStack_220;
  EntityComponentStoreTests *local_218;
  undefined8 uStack_210;
  code *local_208;
  code *pcStack_200;
  EntityComponentStoreTests *local_1f8;
  undefined8 uStack_1f0;
  code *local_1e8;
  code *pcStack_1e0;
  EntityComponentStoreTests *local_1d8;
  undefined8 uStack_1d0;
  code *local_1c8;
  code *pcStack_1c0;
  EntityComponentStoreTests *local_1b8;
  undefined8 uStack_1b0;
  code *local_1a8;
  code *pcStack_1a0;
  EntityComponentStoreTests *local_198;
  undefined8 uStack_190;
  code *local_188;
  code *pcStack_180;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"an entity component store with added entities and with components",
             "");
  uStack_190 = 0;
  pcStack_180 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:135:78)>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:135:78)>
              ::_M_manager;
  local_198 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[4])
            (this,(string *)local_38);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,3);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"getting the string component of an entity gives the expected value"
             ,"");
  uStack_1b0 = 0;
  pcStack_1a0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:157:78)>
                ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:157:78)>
              ::_M_manager;
  local_1b8 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_58);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"getting the int component of an entity gives the expected value",""
            );
  uStack_1d0 = 0;
  pcStack_1c0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:162:75)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:162:75)>
              ::_M_manager;
  local_1d8 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_78);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,3);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,
             "getting a component of an entity that does not exist throws the expected exception",""
            );
  uStack_1f0 = 0;
  pcStack_1e0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:167:94)>
                ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:167:94)>
              ::_M_manager;
  local_1f8 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_98);
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,3);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,
             "getting a component of an entity that does not have that component throws the expected exception"
             ,"");
  uStack_210 = 0;
  pcStack_200 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:171:108)>
                ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:171:108)>
              ::_M_manager;
  local_218 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_b8);
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,3);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"getting all entities","");
  uStack_230 = 0;
  pcStack_220 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:175:32)>
                ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:175:32)>
              ::_M_manager;
  local_238 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,(string *)local_d8);
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,3);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"the expected entities are returned","");
  uStack_250 = 0;
  pcStack_240 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:179:46)>
                ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:179:46)>
              ::_M_manager;
  local_258 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_f8);
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,3);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0]);
  }
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_118,"getting all entities with string components","");
  uStack_270 = 0;
  pcStack_260 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:183:55)>
                ::_M_invoke;
  local_268 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:183:55)>
              ::_M_manager;
  local_278 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,(string *)local_118);
  if (local_268 != (code *)0x0) {
    (*local_268)(&local_278,&local_278,3);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0]);
  }
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_138,"the expected entities are returned","");
  uStack_290 = 0;
  pcStack_280 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:187:46)>
                ::_M_invoke;
  local_288 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:187:46)>
              ::_M_manager;
  local_298 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_138);
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,3);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0]);
  }
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_158,"getting all entities with int components","");
  uStack_2b0 = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:191:52)>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:191:52)>
              ::_M_manager;
  local_2b8 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,(string *)local_158);
  if (local_2a8 != (code *)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,3);
  }
  if (local_158[0] != local_148) {
    operator_delete(local_158[0]);
  }
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"the expected entities are returned","");
  uStack_2d0 = 0;
  pcStack_2c0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:195:46)>
                ::_M_invoke;
  local_2c8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:195:46)>
              ::_M_manager;
  local_2d8 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_178);
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,3);
  }
  if (local_178[0] != local_168) {
    operator_delete(local_178[0]);
  }
  return;
}

Assistant:

virtual void Run()
	{
		Given("an entity component store with added entities and with components", [&]() 
		{
			m_entityComponentStore = ecs::EntityComponentStore<int>();
			m_actualEntities = std::vector<int>();

			m_entities = { 1, 2, 3, 4, 5 };
			for (auto entity : m_entities)
				m_entityComponentStore.addEntity(entity);

			m_entitiesWithStringComponent.push_back(m_entities[2]);
			m_entitiesWithIntComponent.push_back(m_entities[2]);
			m_entitiesWithIntComponent.push_back(m_entities[3]);

			m_expectedStringComponentValue = std::string("test_component1");
			m_expectedIntComponentValue = 7;

			for (auto entity : m_entitiesWithStringComponent)
				m_entityComponentStore.addComponent(entity, m_expectedStringComponentValue);

			for (auto entity : m_entitiesWithIntComponent)
				m_entityComponentStore.addComponent(entity, m_expectedIntComponentValue);
		});
		Then("getting the string component of an entity gives the expected value", [&]()
		{
			std::string component = m_entityComponentStore.getComponentOfEntity<std::string>(m_entitiesWithStringComponent[0]);
			AssertThat(component, ut11::Is::EqualTo(m_expectedStringComponentValue));
		});
		Then("getting the int component of an entity gives the expected value", [&]()
		{
			int component = m_entityComponentStore.getComponentOfEntity<int>(m_entitiesWithIntComponent[0]);
			AssertThat(component, ut11::Is::EqualTo(m_expectedIntComponentValue));
		});
		Then("getting a component of an entity that does not exist throws the expected exception", [&]()
		{
			AssertThat([&]() { m_entityComponentStore.getComponentOfEntity<std::string>(100); }, ut11::Will::Throw<ecs::EntityNotFoundException>());
		});
		Then("getting a component of an entity that does not have that component throws the expected exception", [&]()
		{
			AssertThat([&]() { m_entityComponentStore.getComponentOfEntity<std::string>(m_entities[4]); }, ut11::Will::Throw<ecs::ComponentNotFoundException>());
		});
		When("getting all entities", [&]() 
		{
			m_actualEntities = m_entityComponentStore.getAllEntities();
		});
		Then("the expected entities are returned", [&]() 
		{
			AssertThat(m_actualEntities, ut11::Is::Iterable::EquivalentTo(m_entities));
		});
		When("getting all entities with string components", [&]()
		{
			m_actualEntities = m_entityComponentStore.getAllEntitiesFor<std::string>();
		});
		Then("the expected entities are returned", [&]()
		{
			AssertThat(m_actualEntities, ut11::Is::Iterable::EquivalentTo(m_entitiesWithStringComponent));
		});
		When("getting all entities with int components", [&]()
		{
			m_actualEntities = m_entityComponentStore.getAllEntitiesFor<int>();
		});
		Then("the expected entities are returned", [&]()
		{
			AssertThat(m_actualEntities, ut11::Is::Iterable::EquivalentTo(m_entitiesWithIntComponent));
		});
	}